

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O3

Offset wabt::U32Leb128Length(uint32_t value)

{
  bool bVar1;
  Offset OVar2;
  ulong uVar3;
  
  OVar2 = 0;
  uVar3 = (ulong)value;
  do {
    uVar3 = uVar3 >> 7;
    OVar2 = OVar2 + 1;
    bVar1 = 0x7f < value;
    value = (uint)uVar3;
  } while (bVar1);
  return OVar2;
}

Assistant:

Offset U32Leb128Length(uint32_t value) {
  uint32_t size = 0;
  do {
    value >>= 7;
    size++;
  } while (value != 0);
  return size;
}